

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O3

void Llb_Nonlin4RemoveVar(Llb_Mgr_t_conflict *p,Llb_Var_t *pVar)

{
  Vec_Int_t *__ptr;
  int *__ptr_00;
  
  if (p->pVars[pVar->iVar] == pVar) {
    p->pVars[pVar->iVar] = (Llb_Var_t *)0x0;
    __ptr = pVar->vParts;
    __ptr_00 = __ptr->pArray;
    if (__ptr_00 != (int *)0x0) {
      free(__ptr_00);
    }
    free(__ptr);
    free(pVar);
    return;
  }
  __assert_fail("p->pVars[pVar->iVar] == pVar",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Image.c"
                ,100,"void Llb_Nonlin4RemoveVar(Llb_Mgr_t *, Llb_Var_t *)");
}

Assistant:

void Llb_Nonlin4RemoveVar( Llb_Mgr_t * p, Llb_Var_t * pVar )
{
    assert( p->pVars[pVar->iVar] == pVar );
    p->pVars[pVar->iVar] = NULL;
    Vec_IntFree( pVar->vParts );
    ABC_FREE( pVar );
}